

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_bench.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *col;
  string filename;
  CSVFileInfo info;
  string local_98;
  CSVFileInfo local_78;
  
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,argv[1],(allocator<char> *)&local_78);
    lVar1 = std::chrono::_V2::system_clock::now();
    csv::get_file_info(&local_78,&local_98);
    lVar2 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Parsing took (including disk IO): ",0x22);
    poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) / 1000000000.0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dimensions: ",0xc);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," rows x ",8);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," columns ",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Columns: ",9);
    for (; local_78.col_names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_78.col_names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        local_78.col_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_78.col_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 ((local_78.col_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                 (local_78.col_names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78.col_names);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.filename._M_dataplus._M_p != &local_78.filename.field_2) {
      operator_delete(local_78.filename._M_dataplus._M_p,
                      local_78.filename.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    return 0;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar3 = std::operator<<(poVar3,*argv);
  poVar3 = std::operator<<(poVar3," [file]");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
    using namespace csv;

    if (argc < 2) {
        std::cout << "Usage: " << argv[0] << " [file]" << std::endl;
        exit(1);
    }

    // Benchmark 1: File IO + Parsing
    std::string filename = argv[1];
    auto start = std::chrono::system_clock::now();
    auto info = get_file_info(filename);
    auto end = std::chrono::system_clock::now();
    std::chrono::duration<double> diff = end - start;

    std::cout << "Parsing took (including disk IO): " << diff.count() << std::endl;
    std::cout << "Dimensions: " << info.n_rows << " rows x " << info.n_cols << " columns " << std::endl;
    std::cout << "Columns: ";
    for (auto& col : info.col_names) {
        std::cout << " " << col;
    }
    std::cout << std::endl;

    // Benchmark 2: Parsing Only
    /*
    std::ifstream csv(filename);
    std::stringstream buffer;
    buffer << csv.rdbuf();

    auto csv_str = buffer.str();

    start = std::chrono::system_clock::now();
    parse(csv_str);
    end = std::chrono::system_clock::now();
    diff = end - start;

    std::cout << "Parsing took: " << diff.count() << std::endl;
    */

    return 0;
}